

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.c++
# Opt level: O2

int __thiscall kj::EventLoop::poll(EventLoop *this,pollfd *__fds,nfds_t __nfds,int __timeout)

{
  EventPort *pEVar1;
  Event *this_00;
  int in_EAX;
  int extraout_EAX;
  nfds_t extraout_RDX;
  Executor *this_01;
  
  pEVar1 = (this->port).ptr;
  if (pEVar1 == (EventPort *)0x0) {
    this_01 = (this->executor).ptr.ptr;
    if (this_01 == (Executor *)0x0) goto LAB_00234eb9;
  }
  else {
    in_EAX = (*pEVar1->_vptr_EventPort[1])();
    this_01 = (this->executor).ptr.ptr;
    __timeout = CONCAT31((int3)((uint)__timeout >> 8),this_01 != (Executor *)0x0);
    __nfds = extraout_RDX;
    if (((byte)in_EAX & this_01 != (Executor *)0x0) == 0) goto LAB_00234eb9;
  }
  in_EAX = Executor::poll(this_01,__fds,__nfds,__timeout);
LAB_00234eb9:
  if ((this->head == (Event *)0x0) && (this_00 = this->wouldSleepHead, this_00 != (Event *)0x0)) {
    kj::_::Event::disarm(this_00);
    kj::_::Event::armDepthFirst(this_00);
    return extraout_EAX;
  }
  return in_EAX;
}

Assistant:

void EventLoop::poll() {
  KJ_IF_SOME(p, port) {
    if (p.poll()) {
      // Another thread called wake(). Check for cross-thread events.
      KJ_IF_SOME(e, executor) {
        e->poll();
      }
    }
  } else KJ_IF_SOME(e, executor) {
    e->poll();
  }

  if (head == nullptr && wouldSleepHead != nullptr) {
    // We got nothing by polling. So, enqueue the next would-sleep event instead.
    _::Event* event = wouldSleepHead;
    event->disarm();
    event->armDepthFirst();
  }
}